

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependStruct<RestorePoint>
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,RestorePoint *value)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  LPCWSTR pWVar2;
  Type TVar3;
  _func_int **pp_Var4;
  LPCWSTR pWVar5;
  Type TVar6;
  undefined4 uVar7;
  BufferBuilder *pBVar8;
  ImmutableList<Js::BufferBuilder_*> *pIVar9;
  
  pBVar8 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x50,this->alloc,0x366bee);
  pBVar8->clue = clue;
  pBVar8->offset = 0xffffffff;
  pBVar8->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2fb0;
  pWVar2 = (LPCWSTR)value->m_cMinTokMultiUnits;
  TVar3 = value->m_cMinLineMultiUnits;
  pp_Var4 = *(_func_int ***)&value->m_line;
  pWVar5 = (LPCWSTR)value->lengthDecr;
  TVar6 = value->m_fHadEol;
  uVar7 = *(undefined4 *)&value->field_0x2c;
  pBVar8[1]._vptr_BufferBuilder = *(_func_int ***)value;
  pBVar8[1].clue = pWVar2;
  *(Type *)&pBVar8[1].offset = TVar3;
  pBVar8[2]._vptr_BufferBuilder = pp_Var4;
  pBVar8[2].clue = pWVar5;
  pBVar8[2].offset = TVar6;
  *(undefined4 *)&pBVar8[2].field_0x14 = uVar7;
  pBVar8[3]._vptr_BufferBuilder = (_func_int **)value->m_cMultiUnits;
  pBVar8->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2f90;
  pIVar1 = builder->list;
  pIVar9 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
  pIVar9->value = pBVar8;
  pIVar9->next = pIVar1;
  builder->list = pIVar9;
  return 0x38;
}

Assistant:

uint32 PrependStruct(BufferBuilderList & builder, LPCWSTR clue, TStructType * value)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<TStructType>, clue, *value);
        builder.list = builder.list->Prepend(entry, alloc);

        return sizeof(serialization_alignment TStructType);
    }